

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_test_lots_of_unsubbing_and_subscribing_all_conflated_into_one_unsub_and_sub_Test
::TestBody(SubjectSetRegisterTest_test_lots_of_unsubbing_and_subscribing_all_conflated_into_one_unsub_and_sub_Test
           *this)

{
  allocator<bidfx_public_api::price::subject::Subject> *this_00;
  allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>
  *this_01;
  initializer_list<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>
  __l;
  initializer_list<bidfx_public_api::price::subject::Subject> __l_00;
  bool bVar1;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  *rhs;
  char *pcVar2;
  map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  *rhs_00;
  Subject *local_388;
  AssertHelper local_378;
  Message local_370;
  undefined1 local_368 [8];
  AssertionResult gtest_ar_1;
  ControlOperationEnum local_350 [4];
  pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum> local_340;
  pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum> local_338;
  iterator local_330;
  size_type local_328;
  undefined1 local_320 [8];
  map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  control_set;
  Message local_2e8;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar;
  Subject local_2c0 [24];
  Subject local_2a8 [24];
  Subject local_290 [24];
  iterator local_278;
  size_type local_270;
  undefined1 local_268 [8];
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  subjects_set;
  optional<bidfx_public_api::price::pixie::SubscriptionSync> message;
  Subject local_1c8 [24];
  Subject local_1b0 [24];
  Subject local_198 [24];
  Subject local_180 [24];
  optional<bidfx_public_api::price::pixie::SubscriptionSync> local_168;
  Subject local_f8 [24];
  Subject local_e0 [40];
  Subject local_b8 [24];
  SubjectSetRegister local_a0 [8];
  SubjectSetRegister subject_register;
  SubjectSetRegisterTest_test_lots_of_unsubbing_and_subscribing_all_conflated_into_one_unsub_and_sub_Test
  *this_local;
  
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(local_a0);
  bidfx_public_api::price::subject::Subject::Subject(local_b8,(Subject *)SS_RFS_SUBJECT1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_b8,0);
  subject::Subject::~Subject(local_b8);
  bidfx_public_api::price::subject::Subject::Subject(local_e0,(Subject *)SS_SUBJECT2);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_e0,0);
  subject::Subject::~Subject(local_e0);
  bidfx_public_api::price::subject::Subject::Subject(local_f8,(Subject *)SS_RFQ_SUBJECT3);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_f8,0);
  subject::Subject::~Subject(local_f8);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional(&local_168);
  bidfx_public_api::price::subject::Subject::Subject(local_180,(Subject *)SS_RFS_SUBJECT1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_180,1);
  subject::Subject::~Subject(local_180);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_a0);
  bidfx_public_api::price::subject::Subject::Subject(local_198,(Subject *)SS_SUBJECT1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_198,1);
  subject::Subject::~Subject(local_198);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_a0);
  bidfx_public_api::price::subject::Subject::Subject(local_1b0,(Subject *)SS_SUBJECT1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_1b0,1);
  subject::Subject::~Subject(local_1b0);
  bidfx_public_api::price::subject::Subject::Subject(local_1c8,(Subject *)SS_RFQ_SUBJECT3);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_1c8,1);
  subject::Subject::~Subject(local_1c8);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_a0);
  bidfx_public_api::price::subject::Subject::Subject
            ((Subject *)
             &message.
              super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>.
              _M_payload.
              super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>
              .super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>.
              _M_engaged,(Subject *)SS_RFQ_SUBJECT3);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register
            (local_a0,&message.
                       super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>
                       ._M_payload.
                       super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>
                       .
                       super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>
                       ._M_engaged,1);
  subject::Subject::~Subject
            ((Subject *)
             &message.
              super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>.
              _M_payload.
              super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>
              .super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>.
              _M_engaged);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  bidfx_public_api::price::subject::Subject::Subject(local_2c0,(Subject *)SS_RFS_SUBJECT1);
  bidfx_public_api::price::subject::Subject::Subject(local_2a8,(Subject *)SS_SUBJECT2);
  bidfx_public_api::price::subject::Subject::Subject(local_290,(Subject *)SS_RFQ_SUBJECT3);
  local_278 = local_2c0;
  local_270 = 3;
  this_00 = (allocator<bidfx_public_api::price::subject::Subject> *)
            ((long)&gtest_ar.message_.ptr_ + 7);
  std::allocator<bidfx_public_api::price::subject::Subject>::allocator(this_00);
  __l_00._M_len = local_270;
  __l_00._M_array = local_278;
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::vector((vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
            *)local_268,__l_00,this_00);
  std::allocator<bidfx_public_api::price::subject::Subject>::~allocator
            ((allocator<bidfx_public_api::price::subject::Subject> *)
             ((long)&gtest_ar.message_.ptr_ + 7));
  local_388 = (Subject *)&local_278;
  do {
    local_388 = local_388 + -0x18;
    subject::Subject::~Subject(local_388);
  } while (local_388 != local_2c0);
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::operator->
            ((optional<bidfx_public_api::price::pixie::SubscriptionSync> *)
             &subjects_set.
              super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  rhs = (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
         *)bidfx_public_api::price::pixie::SubscriptionSync::GetSubjects();
  testing::internal::EqHelper<false>::
  Compare<std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>,std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>>
            ((EqHelper<false> *)local_2e0,"subjects_set","message->GetSubjects()",
             (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
              *)local_268,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
  if (!bVar1) {
    testing::Message::Message(&local_2e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&control_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x382,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&control_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
               &local_2e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&control_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
  local_350[3] = 0;
  local_350[2] = 0;
  std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>::
  pair<int,_bidfx_public_api::price::pixie::ControlOperationEnum,_true>
            (&local_340,(int *)(local_350 + 3),local_350 + 2);
  local_350[1] = 2;
  local_350[0] = TOGGLE;
  std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>::
  pair<int,_bidfx_public_api::price::pixie::ControlOperationEnum,_true>
            (&local_338,(int *)(local_350 + 1),local_350);
  local_330 = &local_340;
  local_328 = 2;
  this_01 = (allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>
             *)((long)&gtest_ar_1.message_.ptr_ + 6);
  std::
  allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>::
  allocator(this_01);
  __l._M_len = local_328;
  __l._M_array = local_330;
  std::
  map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  ::map((map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
         *)local_320,__l,(less<unsigned_int> *)((long)&gtest_ar_1.message_.ptr_ + 7),this_01);
  std::
  allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>::
  ~allocator((allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>
              *)((long)&gtest_ar_1.message_.ptr_ + 6));
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::operator->
            ((optional<bidfx_public_api::price::pixie::SubscriptionSync> *)
             &subjects_set.
              super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  rhs_00 = (map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
            *)bidfx_public_api::price::pixie::SubscriptionSync::GetControls();
  testing::internal::EqHelper<false>::
  Compare<std::map<unsigned_int,bidfx_public_api::price::pixie::ControlOperationEnum,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,bidfx_public_api::price::pixie::ControlOperationEnum>>>,std::map<unsigned_int,bidfx_public_api::price::pixie::ControlOperationEnum,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,bidfx_public_api::price::pixie::ControlOperationEnum>>>>
            ((EqHelper<false> *)local_368,"control_set","message->GetControls()",
             (map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
              *)local_320,rhs_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
  if (!bVar1) {
    testing::Message::Message(&local_370);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_368);
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,900,pcVar2);
    testing::internal::AssertHelper::operator=(&local_378,&local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    testing::Message::~Message(&local_370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
  std::
  map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  ::~map((map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
          *)local_320);
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::~vector((vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
             *)local_268);
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional
            ((optional<bidfx_public_api::price::pixie::SubscriptionSync> *)
             &subjects_set.
              super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  SubjectSetRegister::~SubjectSetRegister(local_a0);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, test_lots_of_unsubbing_and_subscribing_all_conflated_into_one_unsub_and_sub)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_RFS_SUBJECT1, false);
    subject_register.Register(SS_SUBJECT2, false);
    subject_register.Register(SS_RFQ_SUBJECT3, false);
    subject_register.NextSubscriptionSync();

    subject_register.Register(SS_RFS_SUBJECT1, true);
    subject_register.Unregister(SS_RFS_SUBJECT1);
    subject_register.Register(SS_SUBJECT1, true);
    subject_register.Unregister(SS_SUBJECT1);
    subject_register.Register(SS_SUBJECT1, true);

    subject_register.Register(SS_RFQ_SUBJECT3, true);
    subject_register.Unregister(SS_RFQ_SUBJECT3);
    subject_register.Register(SS_RFQ_SUBJECT3, true);

    std::optional<SubscriptionSync> message = subject_register.NextSubscriptionSync();
    std::vector<Subject> subjects_set = {SS_RFS_SUBJECT1, SS_SUBJECT2, SS_RFQ_SUBJECT3};
    EXPECT_EQ(subjects_set, message->GetSubjects());
    std::map<uint32_t, ControlOperationEnum> control_set = {{0, ControlOperationEnum::REFRESH}, {2, ControlOperationEnum ::TOGGLE}};
    EXPECT_EQ(control_set, message->GetControls());
}